

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlbits.c
# Opt level: O0

void controlbits(uchar *out,uint32_t *pi)

{
  uint32_t *in_RSI;
  long in_RDI;
  uchar c [5888];
  uint i;
  uchar auStack_1718 [5892];
  uint local_14;
  long local_8;
  
  for (local_14 = 0; local_14 < 0x1700; local_14 = local_14 + 1) {
    auStack_1718[local_14] = '\0';
  }
  local_8 = in_RDI;
  controlbitsfrompermutation(0xc,0x1000,1,0,auStack_1718,in_RSI);
  for (local_14 = 0; local_14 < 0x1700; local_14 = local_14 + 1) {
    *(uchar *)(local_8 + (ulong)local_14) = auStack_1718[local_14];
  }
  return;
}

Assistant:

void controlbits(unsigned char * out, uint32_t * pi)
{
	unsigned int i;
	unsigned char c[ (2*GFBITS - 1) * (1 << GFBITS) / 16 ];

	for (i = 0; i < sizeof(c); i++)
		c[i] = 0;

	controlbitsfrompermutation(GFBITS, (1 << GFBITS), 1, 0, c, pi);

	for (i = 0; i < sizeof(c); i++)
		out[i] = c[i];
}